

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

result_type __thiscall
math::wide_integer::uniform_int_distribution<1024u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<1024u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  bool bVar1;
  uint uVar2;
  value_type_conflict *in_RCX;
  long lVar3;
  long lVar4;
  value_type_conflict *pvVar5;
  uintwide_t<1024U,_unsigned_int,_void,_false> *puVar6;
  sbyte sVar7;
  byte bVar8;
  byte bVar9;
  uintwide_t<1024U,_unsigned_int,_void,_false> local_230;
  uintwide_t<1024U,_unsigned_int,_void,_false> local_1b0;
  result_type range;
  uintwide_t<24U,_unsigned_char,_void,_false> local_b0 [42];
  
  bVar9 = 0;
  bVar8 = 0;
  uintwide_t<1024u,unsigned_int,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
  enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std::
  numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::digits),void>::type__
            (this,'\0',
             (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  uVar2 = 0;
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + (ulong)((bVar8 & 3) == 0) * 4) {
    if ((bVar8 & 3) == 0) {
      uVar2 = std::linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::operator()
                        ((linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *)
                         input_params);
    }
    sVar7 = (bVar8 & 3) << 3;
    *(uint *)(this + lVar3) = *(uint *)(this + lVar3) | (uVar2 >> sVar7 & 0xff) << sVar7;
    bVar8 = bVar8 + 1;
  }
  pvVar5 = in_RCX;
  puVar6 = (uintwide_t<1024U,_unsigned_int,_void,_false> *)&range;
  for (lVar3 = 0x20; lVar3 != 0; lVar3 = lVar3 + -1) {
    (puVar6->values).super_array<unsigned_int,_32UL>.elems[0] = *pvVar5;
    pvVar5 = pvVar5 + (ulong)bVar9 * -2 + 1;
    puVar6 = (uintwide_t<1024U,_unsigned_int,_void,_false> *)
             ((long)puVar6 + ((ulong)bVar9 * -2 + 1) * 4);
  }
  uintwide_t<1024U,_unsigned_int,_void,_false>::limits_helper_min<false>();
  bVar1 = uintwide_t<1024U,_unsigned_int,_void,_false>::operator!=
                    ((uintwide_t<1024U,_unsigned_int,_void,_false> *)&range,
                     (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_230);
  if (!bVar1) {
    pvVar5 = in_RCX + 0x20;
    puVar6 = &local_1b0;
    for (lVar3 = 0x20; lVar3 != 0; lVar3 = lVar3 + -1) {
      (puVar6->values).super_array<unsigned_int,_32UL>.elems[0] = *pvVar5;
      pvVar5 = pvVar5 + (ulong)bVar9 * -2 + 1;
      puVar6 = (uintwide_t<1024U,_unsigned_int,_void,_false> *)
               ((long)puVar6 + ((ulong)bVar9 * -2 + 1) * 4);
    }
    uintwide_t<1024U,_unsigned_int,_void,_false>::limits_helper_max<false>();
    bVar1 = uintwide_t<1024U,_unsigned_int,_void,_false>::operator!=(&local_1b0,local_b0);
    if (!bVar1) goto LAB_0014c6f9;
  }
  lVar3 = 0x20;
  pvVar5 = in_RCX + 0x20;
  puVar6 = &local_230;
  for (lVar4 = lVar3; lVar4 != 0; lVar4 = lVar4 + -1) {
    (puVar6->values).super_array<unsigned_int,_32UL>.elems[0] = *pvVar5;
    pvVar5 = pvVar5 + (ulong)bVar9 * -2 + 1;
    puVar6 = (uintwide_t<1024U,_unsigned_int,_void,_false> *)
             ((long)puVar6 + ((ulong)bVar9 * -2 + 1) * 4);
  }
  pvVar5 = in_RCX;
  puVar6 = &local_1b0;
  for (lVar4 = lVar3; lVar4 != 0; lVar4 = lVar4 + -1) {
    (puVar6->values).super_array<unsigned_int,_32UL>.elems[0] = *pvVar5;
    pvVar5 = pvVar5 + (ulong)bVar9 * -2 + 1;
    puVar6 = (uintwide_t<1024U,_unsigned_int,_void,_false> *)
             ((long)puVar6 + ((ulong)bVar9 * -2 + 1) * 4);
  }
  wide_integer::operator-
            ((uintwide_t<1024U,_unsigned_int,_void,_false> *)&range,&local_230,&local_1b0);
  uintwide_t<1024U,_unsigned_int,_void,_false>::preincrement
            ((uintwide_t<1024U,_unsigned_int,_void,_false> *)&range);
  uintwide_t<1024U,_unsigned_int,_void,_false>::operator%=
            ((uintwide_t<1024U,_unsigned_int,_void,_false> *)this,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)&range);
  puVar6 = &local_230;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (puVar6->values).super_array<unsigned_int,_32UL>.elems[0] = *in_RCX;
    in_RCX = in_RCX + (ulong)bVar9 * -2 + 1;
    puVar6 = (uintwide_t<1024U,_unsigned_int,_void,_false> *)
             ((long)puVar6 + ((ulong)bVar9 * -2 + 1) * 4);
  }
  uintwide_t<1024U,_unsigned_int,_void,_false>::operator+=
            ((uintwide_t<1024U,_unsigned_int,_void,_false> *)this,&local_230);
LAB_0014c6f9:
  return (result_type)SUB83(this,0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }